

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::RgbToBgr
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uchar *puVar4;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  uVar3 = width;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  width = uVar3 * 3;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src_00);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&width,&height,in,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar1 = out->_rowSize;
  if (height * uVar1 != 0) {
    uVar2 = in->_rowSize;
    puVar5 = out->_data + (ulong)(startXOut * 3) + (ulong)(startYOut * uVar1);
    puVar4 = puVar5 + height * uVar1;
    puVar6 = in->_data + (ulong)(startXIn * 3) + (ulong)(startYIn * uVar2);
    do {
      if ((ulong)width != 0) {
        uVar7 = 0;
        do {
          puVar5[uVar7 + 2] = puVar6[uVar7];
          puVar5[uVar7 + 1] = puVar6[uVar7 + 1];
          puVar5[uVar7] = puVar6[uVar7 + 2];
          uVar7 = uVar7 + 3;
        } while (width != uVar7);
      }
      puVar5 = puVar5 + uVar1;
      puVar6 = puVar6 + uVar2;
    } while (puVar5 != puVar4);
  }
  return;
}

Assistant:

void RgbToBgr( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                   uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyRGBImage     ( in, out );

        const uint8_t colorCount = RGB;
        width = width * colorCount;

        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; outX += colorCount, inX += colorCount ) {
                *(outX + 2) = *(inX);
                *(outX + 1) = *(inX + 1);
                *(outX) = *(inX + 2);
            }
        }
    }